

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::egl::anon_unknown_0::BufferAgeTest::iterate(BufferAgeTest *this)

{
  int iVar1;
  TestContext *pTVar2;
  bool bVar3;
  pointer pFVar4;
  pointer pFVar5;
  bool bVar6;
  EGLint EVar7;
  EGLint EVar8;
  deUint32 dVar9;
  Library *egl;
  ulong uVar10;
  pointer pFVar11;
  pointer pFVar12;
  ostream *poVar13;
  int *piVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  Frame *__args;
  Frame *extraout_RDX;
  Frame *extraout_RDX_00;
  Frame *pFVar18;
  Frame *extraout_RDX_01;
  Frame *frame;
  int *piVar19;
  ulong uVar20;
  pointer pFVar21;
  char *message;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *drawTypes;
  NativeWindow *pNVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  float fVar26;
  float fVar27;
  EGLint currentBufferAge;
  Vec4 clearColor;
  FrameSequence frameSequence;
  vector<int,_std::allocator<int>_> bufferAges;
  Frame newFrame;
  Surface refBuffer;
  Surface currentBuffer;
  Random rnd;
  ostringstream stream;
  uint local_2dc;
  Library *local_2d8;
  int local_2d0;
  int local_2cc;
  Vec4 local_2c8;
  int local_2b8;
  undefined4 uStack_2b4;
  long local_2a8 [2];
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  local_298;
  void *local_278;
  iterator iStack_270;
  int *local_268;
  Frame local_260;
  TestLog *local_240;
  Functions *local_238;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  Surface local_1f0;
  Surface local_1d8;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *local_1c0;
  deRandom local_1b8;
  int *local_1a8;
  int *piStack_1a0;
  int *local_198;
  ios_base local_138 [264];
  
  deRandom_init(&local_1b8,this->m_seed);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_240 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  EVar7 = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3057);
  EVar8 = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3056);
  fVar26 = deRandom_getFloat(&local_1b8);
  fVar27 = deRandom_getFloat(&local_1b8);
  local_2d8 = (Library *)CONCAT44(local_2d8._4_4_,fVar27);
  local_2c8.m_data[2] = deRandom_getFloat(&local_1b8);
  local_2c8.m_data[1] = local_2d8._0_4_;
  local_2c8.m_data[3] = 1.0;
  local_298.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268 = (int *)0x0;
  local_278 = (void *)0x0;
  iStack_270._M_current = (int *)0x0;
  local_2d8 = egl;
  local_2c8.m_data[0] = fVar26;
  if (this->m_preserveColorBuffer == true) {
    (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3094);
    dVar9 = (*local_2d8->_vptr_Library[0x1f])();
    iVar15 = 499;
    message = "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED)";
  }
  else {
    (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3095);
    dVar9 = (*local_2d8->_vptr_Library[0x1f])();
    iVar15 = 0x1f5;
    message = "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)";
  }
  eglu::checkError(dVar9,message,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                   ,iVar15);
  local_238 = &this->m_gl;
  iVar16 = EVar8 / 2;
  iVar15 = EVar7 * 2;
  uVar25 = 0;
  local_1c0 = &this->m_oddFrameDrawType;
  local_2d0 = EVar8;
  local_2cc = EVar7;
  do {
    iVar1 = local_2cc;
    iVar24 = local_2d0;
    tcu::Surface::Surface(&local_1d8,local_2cc,local_2d0);
    tcu::Surface::Surface(&local_1f0,iVar1,iVar24);
    local_260.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_260.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_260.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2dc = 0xffffffff;
    drawTypes = &this->m_evenFrameDrawType;
    if ((uVar25 & 1) != 0) {
      drawTypes = local_1c0;
    }
    local_260.width = iVar1;
    local_260.height = iVar24;
    generateRandomFrame(&local_260,drawTypes,(Random *)&local_1b8);
    pFVar5 = local_298.
             super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pFVar4 = local_298.
             super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_298.
        super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_298.
        super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if ((long)local_298.
                super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_298.
                super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar20 = (long)local_298.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_298.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar10 = uVar20;
      if (local_298.
          super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_298.
          super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar10 = 1;
      }
      uVar23 = uVar10 + uVar20;
      if (0x3fffffffffffffe < uVar23) {
        uVar23 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar10,uVar20)) {
        uVar23 = 0x3ffffffffffffff;
      }
      if (uVar23 == 0) {
        pFVar11 = (pointer)0x0;
        pFVar18 = __args;
      }
      else {
        pFVar11 = (pointer)operator_new(uVar23 << 5);
        pFVar18 = extraout_RDX;
      }
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)(pFVar11 + uVar20),&local_260,pFVar18);
      pFVar21 = pFVar11;
      for (pFVar12 = pFVar4; pFVar5 != pFVar12; pFVar12 = pFVar12 + 1) {
        iVar24 = pFVar12->height;
        pFVar21->width = pFVar12->width;
        pFVar21->height = iVar24;
        (pFVar21->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pFVar12->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pFVar21->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pFVar12->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pFVar21->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pFVar12->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pFVar12->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pFVar12->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pFVar12->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pFVar21 = pFVar21 + 1;
      }
      if (pFVar4 != (pointer)0x0) {
        operator_delete(pFVar4,(long)local_298.
                                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pFVar4);
      }
      local_298.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar11 + uVar23;
      local_298.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_start = pFVar11;
    }
    else {
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)
                 local_298.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_260,__args);
      pFVar21 = pFVar5;
    }
    local_298.
    super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar21 + 1;
    (*local_2d8->_vptr_Library[0x2b])
              (local_2d8,this->m_eglDisplay,this->m_eglSurface,0x313d,&local_2dc);
    dVar9 = (*local_2d8->_vptr_Library[0x1f])();
    eglu::checkError(dVar9,
                     "querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_EXT, &currentBufferAge)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                     ,0x205);
    iVar24 = (int)uVar25;
    if (uVar25 < local_2dc) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Fail, the age is invalid. Age: ",0x1f);
      poVar13 = (ostream *)std::ostream::operator<<((ostringstream *)&local_1a8,local_2dc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", frameNdx: ",0xc);
      std::ostream::operator<<(poVar13,iVar24);
      pTVar2 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      std::__cxx11::stringbuf::str();
      tcu::TestContext::setTestResult
                (pTVar2,QP_TEST_RESULT_FAIL,(char *)CONCAT44(uStack_2b4,local_2b8));
LAB_00221ce0:
      if ((long *)CONCAT44(uStack_2b4,local_2b8) != local_2a8) {
        operator_delete((long *)CONCAT44(uStack_2b4,local_2b8),local_2a8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar3 = true;
    }
    else {
      if (((uVar25 != 0) && (local_2dc != 1)) && (this->m_preserveColorBuffer != false)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "Fail, EGL_BUFFER_PRESERVED is set to true, but buffer age is: ",0x3e);
        poVar13 = (ostream *)std::ostream::operator<<((ostringstream *)&local_1a8,local_2dc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," (should be 1)",0xe);
        pTVar2 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        std::__cxx11::stringbuf::str();
        tcu::TestContext::setTestResult
                  (pTVar2,QP_TEST_RESULT_FAIL,(char *)CONCAT44(uStack_2b4,local_2b8));
        goto LAB_00221ce0;
      }
      if (iStack_270._M_current == local_268) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_278,iStack_270,(int *)&local_2dc);
      }
      else {
        *iStack_270._M_current = local_2dc;
        iStack_270._M_current = iStack_270._M_current + 1;
      }
      if (uVar25 < 10) {
        if (local_2dc == 0) {
          (*(this->m_gl).clearColor)
                    (local_2c8.m_data[0],local_2c8.m_data[1],local_2c8.m_data[2],local_2c8.m_data[3]
                    );
          (*(this->m_gl).clear)(0x4000);
        }
        GLES2Renderer::render(this->m_gles2Renderer,local_2cc,local_2d0,&local_260);
        if (this->m_resizeType == RESIZETYPE_BEFORE_SWAP) {
          if ((uVar25 & 1) == 0) {
            pNVar22 = this->m_window;
            piVar19 = &local_1f8;
            local_1f8 = iVar15;
            local_1f4 = iVar16;
          }
          else {
            pNVar22 = this->m_window;
            piVar19 = &local_200;
            local_200 = iVar16;
            local_1fc = iVar15;
          }
          (*pNVar22->_vptr_NativeWindow[6])(pNVar22,piVar19);
        }
        (*local_2d8->_vptr_Library[0x31])(local_2d8,this->m_eglDisplay,this->m_eglSurface);
        dVar9 = (*local_2d8->_vptr_Library[0x1f])();
        eglu::checkError(dVar9,"swapBuffers(m_eglDisplay, m_eglSurface)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                         ,0x22a);
        bVar3 = false;
        if (this->m_resizeType == RESIZETYPE_AFTER_SWAP) {
          if ((uVar25 & 1) == 0) {
            pNVar22 = this->m_window;
            local_208 = iVar15;
            local_204 = iVar16;
          }
          else {
            pNVar22 = this->m_window;
            local_210 = iVar16;
            local_20c = iVar15;
          }
          (*pNVar22->_vptr_NativeWindow[6])();
        }
      }
      else {
        if ((int)local_2dc < 1) {
          (*(this->m_gl).clearColor)
                    (local_2c8.m_data[0],local_2c8.m_data[1],local_2c8.m_data[2],local_2c8.m_data[3]
                    );
          (*(this->m_gl).clear)(0x4000);
          clearColorReference(&local_1f0,&local_2c8);
        }
        else {
          local_1a8 = (int *)0x0;
          piStack_1a0 = (int *)0x0;
          local_198 = (int *)0x0;
          iVar1 = *(int *)((long)local_278 + uVar25 * 4);
          local_2b8 = iVar24;
          while (iVar1 != 0) {
            local_2b8 = local_2b8 - iVar1;
            if (piStack_1a0 == local_198) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_1a8,(iterator)piStack_1a0,
                         &local_2b8);
            }
            else {
              *piStack_1a0 = local_2b8;
              piStack_1a0 = piStack_1a0 + 1;
            }
            iVar1 = *(int *)((long)local_278 + (long)local_2b8 * 4);
          }
          piVar17 = piStack_1a0 + -1;
          piVar19 = local_1a8;
          if (local_1a8 < piVar17 && local_1a8 != piStack_1a0) {
            do {
              piVar14 = piVar19 + 1;
              iVar1 = *piVar19;
              *piVar19 = *piVar17;
              *piVar17 = iVar1;
              piVar17 = piVar17 + -1;
              piVar19 = piVar14;
            } while (piVar14 < piVar17);
          }
          readPixels(local_238,&local_1d8);
          clearColorReference(&local_1f0,&local_2c8);
          pFVar4 = local_298.
                   super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pFVar18 = extraout_RDX_00;
          piVar19 = local_1a8;
          if (local_1a8 != piStack_1a0) {
            do {
              ReferenceRenderer::render
                        ((ReferenceRenderer *)&local_1f0,(Surface *)(pFVar4 + *piVar19),pFVar18);
              piVar19 = piVar19 + 1;
              pFVar18 = extraout_RDX_01;
            } while (piVar19 != piStack_1a0);
          }
          bVar6 = compareToReference(local_240,&local_1f0,&local_1d8,iVar24,iVar24 - local_2dc);
          if (bVar6) {
            if (local_1a8 != (int *)0x0) {
              operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
            }
          }
          else {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Fail, buffer content is not well preserved when age > 0"
                      );
            if (local_1a8 != (int *)0x0) {
              operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
            }
            bVar3 = true;
            if (!bVar6) goto LAB_00221d1d;
          }
        }
        GLES2Renderer::render(this->m_gles2Renderer,local_2cc,local_2d0,&local_260);
        ReferenceRenderer::render((ReferenceRenderer *)&local_1f0,(Surface *)&local_260,frame);
        readPixels(local_238,&local_1d8);
        bVar6 = compareToReference(local_240,&local_1f0,&local_1d8,iVar24,iVar24);
        if (bVar6) {
          if (this->m_resizeType == RESIZETYPE_BEFORE_SWAP) {
            if ((uVar25 & 1) == 0) {
              pNVar22 = this->m_window;
              piVar19 = &local_218;
              local_218 = iVar15;
              local_214 = iVar16;
            }
            else {
              pNVar22 = this->m_window;
              piVar19 = &local_220;
              local_220 = iVar16;
              local_21c = iVar15;
            }
            (*pNVar22->_vptr_NativeWindow[6])(pNVar22,piVar19);
          }
          (*local_2d8->_vptr_Library[0x31])(local_2d8,this->m_eglDisplay,this->m_eglSurface);
          dVar9 = (*local_2d8->_vptr_Library[0x1f])();
          eglu::checkError(dVar9,"swapBuffers(m_eglDisplay, m_eglSurface)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                           ,0x260);
          bVar3 = false;
          if (this->m_resizeType == RESIZETYPE_AFTER_SWAP) {
            if ((uVar25 & 1) == 0) {
              pNVar22 = this->m_window;
              local_228 = iVar15;
              local_224 = iVar16;
            }
            else {
              pNVar22 = this->m_window;
              local_230 = iVar16;
              local_22c = iVar15;
            }
            (*pNVar22->_vptr_NativeWindow[6])();
          }
        }
        else {
          bVar3 = true;
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail, render result is wrong");
        }
      }
    }
LAB_00221d1d:
    if (local_260.draws.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.draws.
                      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_260.draws.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_260.draws.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&local_1f0);
    tcu::Surface::~Surface(&local_1d8);
    if (bVar3) goto LAB_0022234c;
    uVar25 = uVar25 + 1;
  } while (uVar25 != 0x14);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
LAB_0022234c:
  if (local_278 != (void *)0x0) {
    operator_delete(local_278,(long)local_268 - (long)local_278);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector(&local_298);
  return STOP;
}

Assistant:

TestCase::IterateResult BufferAgeTest::iterate (void)
{
	de::Random		rnd					(m_seed);
	const Library&	egl					= m_eglTestCtx.getLibrary();
	tcu::TestLog&	log					= m_testCtx.getLog();
	const int		width				= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int		height				= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float		clearRed			= rnd.getFloat();
	const float		clearGreen			= rnd.getFloat();
	const float		clearBlue			= rnd.getFloat();
	const tcu::Vec4	clearColor			(clearRed, clearGreen, clearBlue, 1.0f);
	const int		numFrames			= 20;
	FrameSequence	frameSequence;
	vector<int>		bufferAges;

	if (m_preserveColorBuffer)
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED));
	else
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));

	for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
	{
		tcu::Surface					currentBuffer			(width, height);
		tcu::Surface					refBuffer				(width, height);
		Frame							newFrame				(width, height);
		EGLint							currentBufferAge		= -1;

		if (frameNdx % 2 == 0)
			generateRandomFrame(&newFrame, m_evenFrameDrawType, rnd);
		else
			generateRandomFrame(&newFrame, m_oddFrameDrawType, rnd);

		frameSequence.push_back(newFrame);

		EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_EXT, &currentBufferAge));

		if (currentBufferAge > frameNdx || currentBufferAge < 0) // invalid buffer age
		{
			std::ostringstream stream;
			stream << "Fail, the age is invalid. Age: " << currentBufferAge << ", frameNdx: " << frameNdx;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
			return STOP;
		}

		if (frameNdx > 0 && m_preserveColorBuffer && currentBufferAge != 1)
		{
			std::ostringstream stream;
			stream << "Fail, EGL_BUFFER_PRESERVED is set to true, but buffer age is: " << currentBufferAge << " (should be 1)";
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
			return STOP;
		}

		bufferAges.push_back(currentBufferAge);
		DE_ASSERT((int)bufferAges.size() == frameNdx+1);

		// during first half, just keep rendering without reading pixel back to mimic ordinary use case
		if (frameNdx < numFrames/2)
		{
			if (currentBufferAge == 0)
				clearColorScreen(m_gl, clearColor);

			m_gles2Renderer->render(width, height, newFrame);

			if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
			{
				if (frameNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));

			if (m_resizeType == RESIZETYPE_AFTER_SWAP)
			{
				if (frameNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			continue;
		}

		// do verification in the second half
		if (currentBufferAge > 0) //buffer contain previous content, need to verify
		{
			const vector<int> framesOnBuffer = getFramesOnBuffer(bufferAges, frameNdx);
			readPixels(m_gl, &currentBuffer);
			clearColorReference(&refBuffer, clearColor);

			for (vector<int>::const_iterator it = framesOnBuffer.begin(); it != framesOnBuffer.end(); it++)
				m_refRenderer->render(&refBuffer, frameSequence[*it]);

			if (compareToReference(log, refBuffer, currentBuffer, frameNdx, frameNdx-currentBufferAge) == false)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, buffer content is not well preserved when age > 0");
				return STOP;
			}
		}
		else // currentBufferAge == 0, content is undefined, clear the buffer, currentBufferAge < 0 is ruled out at the beginning
		{
			clearColorScreen(m_gl, clearColor);
			clearColorReference(&refBuffer, clearColor);
		}

		m_gles2Renderer->render(width, height, newFrame);
		m_refRenderer->render(&refBuffer, newFrame);

		readPixels(m_gl, &currentBuffer);

		if (compareToReference(log, refBuffer, currentBuffer, frameNdx, frameNdx) == false)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, render result is wrong");
			return STOP;
		}

		if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
		{
			if (frameNdx % 2 == 0)
				m_window->setSurfaceSize(IVec2(width*2, height/2));
			else
				m_window->setSurfaceSize(IVec2(height/2, width*2));
		}

		EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));

		if (m_resizeType == RESIZETYPE_AFTER_SWAP)
		{
			if (frameNdx % 2 == 0)
				m_window->setSurfaceSize(IVec2(width*2, height/2));
			else
				m_window->setSurfaceSize(IVec2(height/2, width*2));
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}